

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directize.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_157::Directize::run(Directize *this,Module *module)

{
  byte bVar1;
  Module *pMVar2;
  bool bVar3;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *pvVar4;
  reference this_00;
  pointer pTVar5;
  pointer pEVar6;
  Name *__k;
  reference __in;
  type *this_01;
  reference pNVar7;
  mapped_type *pmVar8;
  PassRunner *runner;
  FunctionDirectizer local_308;
  undefined1 auStack_1c8 [8];
  Name name;
  _Node_iterator_base<wasm::Name,_true> local_1b0;
  iterator __end3;
  iterator __begin3;
  type *__range3;
  type *names;
  type *_;
  _Self local_180;
  iterator __end2_3;
  iterator __begin2_3;
  Map *__range2_3;
  Func local_160;
  undefined1 local_140 [8];
  ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  anon_class_8_1_6c9b2fa3 local_100;
  anon_class_8_1_6c9b2fa3 canOptimize;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2_2;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *table_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *__range2_1;
  pointer local_b0;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *table;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *__range2;
  TableInfoMap tables;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  Module *pMStack_18;
  bool initialContentsImmutable;
  Module *module_local;
  Directize *this_local;
  
  pMStack_18 = module;
  module_local = (Module *)this;
  bVar3 = std::
          vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ::empty(&module->tables);
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"directize-initial-contents-immutable",&local_41);
    bVar3 = Pass::hasArgument(&this->super_Pass,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    local_19 = bVar3;
    std::
    unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
    ::unordered_map((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                     *)&__range2);
    pvVar4 = &pMStack_18->tables;
    __end2 = std::
             vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ::begin(pvVar4);
    table = (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
            std::
            vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ::end(pvVar4);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                                       *)&table), bVar3) {
      local_b0 = (pointer)__gnu_cxx::
                          __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                          ::operator*(&__end2);
      bVar1 = local_19;
      pTVar5 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)local_b0);
      pmVar8 = std::
               unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
               ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                             *)&__range2,(key_type *)pTVar5);
      pMVar2 = pMStack_18;
      pmVar8->initialContentsImmutable = (bool)(bVar1 & 1);
      std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator*
                ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)local_b0);
      std::make_unique<wasm::TableUtils::FlatTable,wasm::Module&,wasm::Table&>
                ((Module *)&__range2_1,(Table *)pMVar2);
      pTVar5 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                         ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)local_b0);
      pmVar8 = std::
               unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
               ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                             *)&__range2,(key_type *)pTVar5);
      std::
      unique_ptr<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>::
      operator=(&pmVar8->flatTable,
                (unique_ptr<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>
                 *)&__range2_1);
      std::
      unique_ptr<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>::
      ~unique_ptr((unique_ptr<wasm::TableUtils::FlatTable,_std::default_delete<wasm::TableUtils::FlatTable>_>
                   *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
      ::operator++(&__end2);
    }
    pvVar4 = &pMStack_18->tables;
    __end2_1 = std::
               vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
               ::begin(pvVar4);
    table_1 = (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
              std::
              vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ::end(pvVar4);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                               *)&table_1), pMVar2 = pMStack_18, bVar3) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                ::operator*(&__end2_1);
      pTVar5 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->(this_00);
      bVar3 = Importable::imported(&pTVar5->super_Importable);
      if (bVar3) {
        pTVar5 = std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::operator->
                           (this_00);
        pmVar8 = std::
                 unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                 ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                               *)&__range2,(key_type *)pTVar5);
        pmVar8->mayBeModified = true;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
      ::operator++(&__end2_1);
    }
    __end2_2 = std::
               vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ::begin(&pMStack_18->exports);
    ex = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
         std::
         vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ::end(&pMVar2->exports);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                               *)&ex), bVar3) {
      canOptimize.tables =
           (TableInfoMap *)
           __gnu_cxx::
           __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
           ::operator*(&__end2_2);
      pEVar6 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                          canOptimize.tables);
      if (pEVar6->kind == Table) {
        pEVar6 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           ((unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                            canOptimize.tables);
        __k = Export::getInternalName(pEVar6);
        pmVar8 = std::
                 unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                 ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                               *)&__range2,__k);
        pmVar8->mayBeModified = true;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
      ::operator++(&__end2_2);
    }
    local_100.tables = (TableInfoMap *)&__range2;
    bVar3 = run::anon_class_8_1_6c9b2fa3::operator()(&local_100);
    pMVar2 = pMStack_18;
    if (bVar3) {
      std::
      function<void(wasm::Function*,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>&)>
      ::
      function<wasm::(anonymous_namespace)::Directize::run(wasm::Module*)::_lambda(wasm::Function*,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>&)_1_,void>
                ((function<void(wasm::Function*,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>&)>
                  *)&local_160,(anon_class_1_0_00000001 *)((long)&__range2_3 + 7));
      wasm::ModuleUtils::
      ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
      ::ParallelFunctionAnalysis
                ((ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                  *)local_140,pMVar2,&local_160);
      std::
      function<void_(wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_&)>
      ::~function((function<void_(wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_&)>
                   *)&local_160);
      __end2_3 = std::
                 map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                 ::begin((map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                          *)&analysis);
      local_180._M_node =
           (_Base_ptr)
           std::
           map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
           ::end((map<wasm::Function_*,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                  *)&analysis);
      while (bVar3 = std::operator!=(&__end2_3,&local_180), bVar3) {
        __in = std::
               _Rb_tree_iterator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
               ::operator*(&__end2_3);
        std::
        get<0ul,wasm::Function*const,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>>
                  (__in);
        this_01 = std::
                  get<1ul,wasm::Function*const,std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>>
                            (__in);
        __end3 = std::
                 unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                 ::begin(this_01);
        local_1b0._M_cur =
             (__node_type *)
             std::
             unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
             ::end(this_01);
        while (bVar3 = std::__detail::operator!=
                                 (&__end3.super__Node_iterator_base<wasm::Name,_true>,&local_1b0),
              bVar3) {
          pNVar7 = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end3);
          auStack_1c8 = (undefined1  [8])(pNVar7->super_IString).str._M_len;
          name.super_IString.str._M_len = (size_t)(pNVar7->super_IString).str._M_str;
          pmVar8 = std::
                   unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                   ::operator[]((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                                 *)&__range2,(key_type *)auStack_1c8);
          pmVar8->mayBeModified = true;
          std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end3);
        }
        std::
        _Rb_tree_iterator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>
        ::operator++(&__end2_3);
      }
      bVar3 = run::anon_class_8_1_6c9b2fa3::operator()(&local_100);
      if (bVar3) {
        FunctionDirectizer::FunctionDirectizer(&local_308,(TableInfoMap *)&__range2);
        runner = Pass::getPassRunner(&this->super_Pass);
        WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
        ::run(&local_308.
               super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionDirectizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionDirectizer,_void>_>_>
              ,runner,pMStack_18);
        FunctionDirectizer::~FunctionDirectizer(&local_308);
      }
      analysis._53_3_ = 0;
      analysis._52_1_ = !bVar3;
      wasm::ModuleUtils::
      ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
      ::~ParallelFunctionAnalysis
                ((ParallelFunctionAnalysis<std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                  *)local_140);
    }
    else {
      analysis._52_4_ = 1;
    }
    std::
    unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
    ::~unordered_map((unordered_map<wasm::Name,_wasm::(anonymous_namespace)::TableInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::TableInfo>_>_>
                      *)&__range2);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (module->tables.empty()) {
      return;
    }

    // TODO: consider a per-table option here
    auto initialContentsImmutable =
      hasArgument("directize-initial-contents-immutable");

    // Set up the initial info.
    TableInfoMap tables;
    for (auto& table : module->tables) {
      tables[table->name].initialContentsImmutable = initialContentsImmutable;
      tables[table->name].flatTable =
        std::make_unique<TableUtils::FlatTable>(*module, *table);
    }

    // Next, look at the imports and exports.

    for (auto& table : module->tables) {
      if (table->imported()) {
        tables[table->name].mayBeModified = true;
      }
    }

    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Table) {
        tables[*ex->getInternalName()].mayBeModified = true;
      }
    }

    // This may already be enough information to know that we can't optimize
    // anything. If so, skip scanning all the module contents.
    auto canOptimize = [&]() {
      for (auto& [_, info] : tables) {
        if (info.canOptimize()) {
          return true;
        }
      }
      return false;
    };

    if (!canOptimize()) {
      return;
    }

    // Find which tables have sets.

    using TablesWithSet = std::unordered_set<Name>;

    ModuleUtils::ParallelFunctionAnalysis<TablesWithSet> analysis(
      *module, [&](Function* func, TablesWithSet& tablesWithSet) {
        if (func->imported()) {
          return;
        }

        struct Finder : public PostWalker<Finder> {
          TablesWithSet& tablesWithSet;

          Finder(TablesWithSet& tablesWithSet) : tablesWithSet(tablesWithSet) {}

          void visitTableSet(TableSet* curr) {
            tablesWithSet.insert(curr->table);
          }
          void visitTableFill(TableFill* curr) {
            tablesWithSet.insert(curr->table);
          }
          void visitTableCopy(TableCopy* curr) {
            tablesWithSet.insert(curr->destTable);
          }
          void visitTableInit(TableInit* curr) {
            tablesWithSet.insert(curr->table);
          }
        };

        Finder(tablesWithSet).walkFunction(func);
      });

    for (auto& [_, names] : analysis.map) {
      for (auto name : names) {
        tables[name].mayBeModified = true;
      }
    }

    // Perhaps the new information about tables with sets shows we cannot
    // optimize.
    if (!canOptimize()) {
      return;
    }

    // We can optimize!
    FunctionDirectizer(tables).run(getPassRunner(), module);
  }